

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_iCCP(ucvector *out,LodePNGInfo *info,LodePNGCompressSettings *zlibsettings)

{
  size_t __n;
  uchar *chunk_00;
  uint uVar1;
  char *orig;
  size_t sVar2;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  size_t local_38;
  uchar *local_30;
  uchar *local_28;
  
  local_28 = (uchar *)0x0;
  local_30 = (uchar *)0x0;
  local_38 = 0;
  __n = 0xffffffffffffffff;
  do {
    sVar2 = __n;
    __n = sVar2 + 1;
  } while (info->iccp_name[sVar2 + 1] != '\0');
  uVar1 = 0x59;
  if (0xffffffffffffffb0 < sVar2 - 0x4f) {
    if (zlibsettings->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar1 = lodepng_zlib_compress
                        (&local_30,&local_38,info->iccp_profile,(ulong)info->iccp_profile_size,
                         zlibsettings);
    }
    else {
      uVar1 = (*zlibsettings->custom_zlib)
                        (&local_30,&local_38,info->iccp_profile,(ulong)info->iccp_profile_size,
                         zlibsettings);
    }
    if (uVar1 == 0) {
      uVar1 = lodepng_chunk_init(&local_28,out,(int)local_38 + (int)__n + 2,"iCCP");
      chunk_00 = local_28;
      if (uVar1 == 0) {
        memcpy(local_28 + 8,info->iccp_name,__n);
        (chunk_00 + sVar2 + 9)[0] = '\0';
        (chunk_00 + sVar2 + 9)[1] = '\0';
        if (local_38 != 0) {
          memcpy(chunk_00 + sVar2 + 0xb,local_30,local_38);
        }
        lodepng_chunk_generate_crc(chunk_00);
        uVar1 = 0;
      }
    }
    free(local_30);
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_iCCP(ucvector* out, const LodePNGInfo* info, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t keysize = lodepng_strlen(info->iccp_name);

  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  error = zlib_compress(&compressed, &compressedsize,
                        info->iccp_profile, info->iccp_profile_size, zlibsettings);
  if(!error) {
    size_t size = keysize + 2 + compressedsize;
    error = lodepng_chunk_init(&chunk, out, size, "iCCP");
  }
  if(!error) {
    lodepng_memcpy(chunk + 8, info->iccp_name, keysize);
    chunk[8 + keysize] = 0; /*null termination char*/
    chunk[9 + keysize] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + 10 + keysize, compressed, compressedsize);
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}